

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

void __thiscall
helics::ConnectorFederateManager::ConnectorFederateManager
          (ConnectorFederateManager *this,Core *coreObj,Federate *ffed,LocalFederateId fid,
          bool singleThreaded)

{
  this->coreObject = coreObj;
  (this->filters).m_obj.dataStorage.csize = 0;
  (this->filters).m_obj.dataStorage.dataptr =
       (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0;
  (this->filters).m_obj.dataStorage.dataSlotsAvailable = 0;
  (this->filters).m_obj.dataStorage.dataSlotIndex = 0;
  (this->filters).m_obj.dataStorage.bsize = 0x20;
  (this->filters).m_obj.dataStorage.freeSlotsAvailable = 0;
  (this->filters).m_obj.dataStorage.freeIndex = 0;
  (this->filters).m_obj.dataStorage.freeblocks =
       (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0;
  (this->filters).m_obj.names.csize = 0;
  (this->filters).m_obj.names.dataptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->filters).m_obj.names.dataSlotsAvailable = 0;
  (this->filters).m_obj.names.dataSlotIndex = 0;
  (this->filters).m_obj.names.bsize = 0x20;
  (this->filters).m_obj.names.freeSlotsAvailable = 0;
  (this->filters).m_obj.names.freeIndex = 0;
  (this->filters).m_obj.names.freeblocks =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->filters).m_obj.lookup._M_h._M_buckets = &(this->filters).m_obj.lookup._M_h._M_single_bucket
  ;
  (this->filters).m_obj.lookup._M_h._M_bucket_count = 1;
  (this->filters).m_obj.lookup._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->filters).m_obj.lookup._M_h._M_element_count = 0;
  (this->filters).m_obj.lookup._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->filters).m_obj.lookup._M_h._M_rehash_policy._M_next_resize = 0;
  (this->filters).m_obj.lookup._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->filters).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->filters).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->filters).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->filters).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->filters).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->filters).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->filters).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  (this->filters).enabled = !singleThreaded;
  (this->translators).m_obj.dataStorage.csize = 0;
  (this->translators).m_obj.dataStorage.dataptr = (Translator **)0x0;
  (this->translators).m_obj.dataStorage.dataSlotsAvailable = 0;
  (this->translators).m_obj.dataStorage.dataSlotIndex = 0;
  (this->translators).m_obj.dataStorage.bsize = 0x20;
  (this->translators).m_obj.dataStorage.freeSlotsAvailable = 0;
  (this->translators).m_obj.dataStorage.freeIndex = 0;
  (this->translators).m_obj.dataStorage.freeblocks = (Translator **)0x0;
  (this->translators).m_obj.names.csize = 0;
  (this->translators).m_obj.names.dataptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->translators).m_obj.names.dataSlotsAvailable = 0;
  (this->translators).m_obj.names.dataSlotIndex = 0;
  (this->translators).m_obj.names.bsize = 0x20;
  (this->translators).m_obj.names.freeSlotsAvailable = 0;
  (this->translators).m_obj.names.freeIndex = 0;
  (this->translators).m_obj.names.freeblocks =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->translators).m_obj.lookup._M_h._M_buckets =
       &(this->translators).m_obj.lookup._M_h._M_single_bucket;
  (this->translators).m_obj.lookup._M_h._M_bucket_count = 1;
  (this->translators).m_obj.lookup._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->translators).m_obj.lookup._M_h._M_element_count = 0;
  (this->translators).m_obj.lookup._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->translators).m_obj.lookup._M_h._M_rehash_policy._M_next_resize = 0;
  (this->translators).m_obj.lookup._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->translators).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->translators).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->translators).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->translators).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->translators).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->translators).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->translators).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  (this->translators).enabled = !singleThreaded;
  this->fed = ffed;
  (this->fedID).fid = fid.fid;
  return;
}

Assistant:

ConnectorFederateManager::ConnectorFederateManager(Core* coreObj,
                                                   Federate* ffed,
                                                   LocalFederateId fid,
                                                   bool singleThreaded):
    coreObject(coreObj), filters(!singleThreaded), translators(!singleThreaded), fed(ffed),
    fedID(fid)
{
}